

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void regress(FILE *in)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 local_4f0 [8];
  regex_t re;
  char *bpname;
  char *badpat;
  size_t ne;
  char erbuf [100];
  int i;
  int nf;
  char *f [10];
  char inbuf [1000];
  FILE *in_local;
  
  re.re_g = (re_guts *)anon_var_dwarf_1778;
  while( true ) {
    do {
      pcVar8 = fgets((char *)(f + 9),1000,(FILE *)in);
      if (pcVar8 == (char *)0x0) {
        sVar9 = regerror(2,(regex_t *)0x0,(char *)&ne,100);
        iVar5 = strcmp((char *)&ne,"invalid regular expression");
        if ((iVar5 != 0) || (sVar10 = strlen("invalid regular expression"), sVar9 != sVar10 + 1)) {
          fprintf(_stderr,"end: regerror() test gave `%s\' not `%s\'\n",&ne,
                  "invalid regular expression");
          status = 1;
        }
        sVar9 = regerror(2,(regex_t *)0x0,(char *)&ne,10);
        iVar5 = strncmp((char *)&ne,"invalid regular expression",9);
        if (((iVar5 != 0) || (erbuf[1] != '\0')) ||
           (sVar10 = strlen("invalid regular expression"), sVar9 != sVar10 + 1)) {
          fprintf(_stderr,"end: regerror() short test gave `%s\' not `%.*s\'\n",&ne,9,
                  "invalid regular expression");
          status = 1;
        }
        sVar9 = regerror(0x102,(regex_t *)0x0,(char *)&ne,100);
        iVar5 = strcmp((char *)&ne,(char *)re.re_g);
        if ((iVar5 != 0) || (sVar10 = strlen((char *)re.re_g), sVar9 != sVar10 + 1)) {
          fprintf(_stderr,"end: regerror() ITOA test gave `%s\' not `%s\'\n",&ne,re.re_g);
          status = 1;
        }
        re.re_nsub = (size_t)re.re_g;
        sVar9 = regerror(0xff,(regex_t *)local_4f0,(char *)&ne,100);
        iVar5 = atoi((char *)&ne);
        if (iVar5 == 2) {
          sVar10 = strlen((char *)&ne);
          if (sVar9 != sVar10 + 1) {
            fprintf(_stderr,"end: regerror() ATOI test len(`%s\') = %ld\n",&ne,2);
            status = 1;
          }
        }
        else {
          fprintf(_stderr,"end: regerror() ATOI test gave `%s\' not `%ld\'\n",&ne,2);
          status = 1;
        }
        return;
      }
      line = line + 1;
    } while (((char)f[9] == '#') || ((char)f[9] == '\n'));
    sVar9 = strlen((char *)(f + 9));
    *(undefined1 *)((long)f + sVar9 + 0x47) = 0;
    if (debug != 0) {
      fprintf(_stdout,"%d:\n",(ulong)(uint)line);
    }
    iVar5 = split((char *)(f + 9),(char **)&i,10,"\t\t");
    if (iVar5 < 3) break;
    erbuf[0x60] = '\0';
    erbuf[0x61] = '\0';
    erbuf[0x62] = '\0';
    erbuf[99] = '\0';
    for (; pcVar2 = f[1], pcVar1 = f[0], pcVar8 = _i, (int)erbuf._96_4_ < iVar5;
        erbuf._96_4_ = erbuf._96_4_ + 1) {
      iVar6 = strcmp(*(char **)(&i + (long)(int)erbuf._96_4_ * 2),"\"\"");
      if (iVar6 == 0) {
        *(char **)(&i + (long)(int)erbuf._96_4_ * 2) = "";
      }
    }
    if (iVar5 < 4) {
      f[2] = (char *)0x0;
    }
    pcVar3 = f[2];
    if (iVar5 < 5) {
      f[3] = (char *)0x0;
    }
    pcVar4 = f[3];
    iVar5 = options(99,f[0]);
    try(pcVar8,pcVar1,pcVar2,pcVar3,pcVar4,iVar5);
    iVar5 = opt(0x26,f[0]);
    pcVar4 = f[3];
    pcVar3 = f[2];
    pcVar2 = f[1];
    pcVar1 = f[0];
    pcVar8 = _i;
    if (iVar5 != 0) {
      uVar7 = options(99,f[0]);
      try(pcVar8,pcVar1,pcVar2,pcVar3,pcVar4,uVar7 & 0xfffffffe);
    }
  }
  fprintf(_stderr,"bad input, line %d\n",(ulong)(uint)line);
  exit(1);
}

Assistant:

static void
regress(in)
FILE *in;
{
	char inbuf[1000];
#	define	MAXF	10
	char *f[MAXF];
	int nf;
	int i;
	char erbuf[100];
	size_t ne;
	char *badpat = "invalid regular expression";
#	define	SHORT	10
	char *bpname = "REG_BADPAT";
	regex_t re;

	while (fgets(inbuf, sizeof(inbuf), in) != NULL) {
		line++;
		if (inbuf[0] == '#' || inbuf[0] == '\n')
			continue;			/* NOTE CONTINUE */
		inbuf[strlen(inbuf)-1] = '\0';	/* get rid of stupid \n */
		if (debug)
			fprintf(stdout, "%d:\n", line);
		nf = split(inbuf, f, MAXF, "\t\t");
		if (nf < 3) {
			fprintf(stderr, "bad input, line %d\n", line);
			exit(1);
		}
		for (i = 0; i < nf; i++)
			if (strcmp(f[i], "\"\"") == 0)
				f[i] = "";
		if (nf <= 3)
			f[3] = NULL;
		if (nf <= 4)
			f[4] = NULL;
		try(f[0], f[1], f[2], f[3], f[4], options('c', f[1]));
		if (opt('&', f[1]))	/* try with either type of RE */
			try(f[0], f[1], f[2], f[3], f[4],
					options('c', f[1]) &~ REG_EXTENDED);
	}

	ne = regerror(REG_BADPAT, (regex_t *)NULL, erbuf, sizeof(erbuf));
	if (strcmp(erbuf, badpat) != 0 || ne != strlen(badpat)+1) {
		fprintf(stderr, "end: regerror() test gave `%s' not `%s'\n",
							erbuf, badpat);
		status = 1;
	}
	ne = regerror(REG_BADPAT, (regex_t *)NULL, erbuf, (size_t)SHORT);
	if (strncmp(erbuf, badpat, SHORT-1) != 0 || erbuf[SHORT-1] != '\0' ||
						ne != strlen(badpat)+1) {
		fprintf(stderr, "end: regerror() short test gave `%s' not `%.*s'\n",
						erbuf, SHORT-1, badpat);
		status = 1;
	}
	ne = regerror(REG_ITOA|REG_BADPAT, (regex_t *)NULL, erbuf, sizeof(erbuf));
	if (strcmp(erbuf, bpname) != 0 || ne != strlen(bpname)+1) {
		fprintf(stderr, "end: regerror() ITOA test gave `%s' not `%s'\n",
						erbuf, bpname);
		status = 1;
	}
	re.re_endp = bpname;
	ne = regerror(REG_ATOI, &re, erbuf, sizeof(erbuf));
	if (atoi(erbuf) != (int)REG_BADPAT) {
		fprintf(stderr, "end: regerror() ATOI test gave `%s' not `%ld'\n",
						erbuf, (long)REG_BADPAT);
		status = 1;
	} else if (ne != strlen(erbuf)+1) {
		fprintf(stderr, "end: regerror() ATOI test len(`%s') = %ld\n",
						erbuf, (long)REG_BADPAT);
		status = 1;
	}
}